

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalBenchmarks.hpp
# Opt level: O3

void benchmarks::SignalBenchmarks<descriptors::signal::wigwag::Ui>::Create
               (BenchmarkContext *context)

{
  ulong __n;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong count;
  ulong *puVar2;
  ulong uVar3;
  int64_t i;
  long lVar4;
  Storage<wigwag::signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>_>
  *s_00;
  StorageArray<wigwag::signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>_>
  s;
  string local_68;
  StorageArray<wigwag::signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>_>
  local_48;
  anon_class_8_1_54a39813 local_38;
  
  count = context->_iterationsCount;
  __n = count * 8;
  uVar3 = 0xffffffffffffffff;
  if (__n < 0xfffffffffffffff8) {
    uVar3 = __n + 8;
  }
  local_48._size = count;
  puVar2 = (ulong *)operator_new__(-(ulong)(count >> 0x3d != 0) | uVar3);
  *puVar2 = count;
  s_00 = (Storage<wigwag::signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>_>
          *)(puVar2 + 1);
  local_48._arr = s_00;
  if (0 < (long)count) {
    lVar4 = 0;
    memset(s_00,0,__n);
    do {
      Create::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)&local_68,&s_00->_obj);
      lVar4 = lVar4 + 1;
      s_00 = s_00 + 1;
    } while (lVar4 < (long)count);
  }
  paVar1 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"signal","");
  (*context->_vptr_BenchmarkContext[2])(context,&local_68,count);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"destroy","");
  local_38.s = &local_48;
  BenchmarkContext::
  Profile<benchmarks::SignalBenchmarks<descriptors::signal::wigwag::Ui>::Create(benchmarks::BenchmarkContext&)::_lambda()_1_>
            (context,&local_68,count,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (local_48._arr !=
      (Storage<wigwag::signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>_>
       *)0x0) {
    operator_delete__(local_48._arr + -1);
  }
  return;
}

Assistant:

static void Create(BenchmarkContext& context)
        {
            const auto n = context.GetIterationsCount();

            StorageArray<SignalType> s(n);

            s.Construct();
            s.ForEach([](SignalType& s){ ConnectionType(s.connect(SignalsDesc_::MakeHandler())); s(); });
            context.MeasureMemory("signal", n);
            context.Profile("destroy", n, [&]{ s.Destruct(); });
        }